

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

PropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyIndex_Internal<false>
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord)

{
  bool bVar1;
  int iVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<int> *pDStack_28;
  BigPropertyIndex dataPropertyIndex;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<int> *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&descriptor,&stack0xffffffffffffffd8);
  if (((bVar1) && ((pDStack_28->Attributes & 8) == 0)) &&
     (iVar2 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_28),
     iVar2 < 0xffff)) {
    this_local._6_2_ = (PropertyIndex)iVar2;
  }
  else {
    this_local._6_2_ = 0xffff;
  }
  return this_local._6_2_;
}

Assistant:

PropertyIndex DictionaryTypeHandlerBase<BigPropertyIndex>::GetPropertyIndex_Internal(PropertyRecord const* propertyRecord)
    {
        DictionaryPropertyDescriptor<BigPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            BigPropertyIndex dataPropertyIndex = descriptor->GetDataPropertyIndex<allowLetConstGlobal>();
            if (dataPropertyIndex < Constants::NoSlot)
            {
                return (PropertyIndex)dataPropertyIndex;
            }
        }
        return Constants::NoSlot;
    }